

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Index * sqlite3FindIndex(sqlite3 *db,char *zName,char *zDb)

{
  Schema *pSVar1;
  int iVar2;
  uint local_3c;
  Schema *pSchema;
  int j;
  int i;
  Index *p;
  char *zDb_local;
  char *zName_local;
  sqlite3 *db_local;
  
  _j = (Index *)0x0;
  pSchema._4_4_ = 0;
  while( true ) {
    if (db->nDb <= (int)pSchema._4_4_) {
      return _j;
    }
    if ((int)pSchema._4_4_ < 2) {
      local_3c = pSchema._4_4_ ^ 1;
    }
    else {
      local_3c = pSchema._4_4_;
    }
    pSVar1 = db->aDb[(int)local_3c].pSchema;
    if (((zDb == (char *)0x0) || (iVar2 = sqlite3DbIsNamed(db,local_3c,zDb), iVar2 != 0)) &&
       (_j = (Index *)sqlite3HashFind(&pSVar1->idxHash,zName), _j != (Index *)0x0)) break;
    pSchema._4_4_ = pSchema._4_4_ + 1;
  }
  return _j;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3FindIndex(sqlite3 *db, const char *zName, const char *zDb){
  Index *p = 0;
  int i;
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    Schema *pSchema = db->aDb[j].pSchema;
    assert( pSchema );
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&pSchema->idxHash, zName);
    if( p ) break;
  }
  return p;
}